

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall cs::repl::exec(repl *this,string *code)

{
  iterator *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_type sVar4;
  pointer pcVar5;
  element_type *peVar6;
  _Elt_pointer pbVar7;
  size_t sVar8;
  string *code_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  exception *peVar13;
  long *plVar14;
  size_type *psVar15;
  size_type sVar16;
  repl *prVar17;
  int iVar18;
  string version_str;
  string line;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  repl *local_220;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string *local_1b8;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->line_num = this->line_num + 1;
  sVar4 = code->_M_string_length;
  if (sVar4 == 0) {
    return;
  }
  pcVar5 = (code->_M_dataplus)._M_p;
  sVar16 = 0;
  iVar18 = 0;
  local_220 = this;
  local_1b8 = code;
  do {
    if (iVar18 == 1) {
      iVar9 = isspace((int)pcVar5[sVar16]);
      iVar18 = 1;
      if (iVar9 == 0) {
        std::__cxx11::string::push_back((char)&this->cmd_buff);
      }
    }
    else {
      if (iVar18 != 0) goto LAB_0025a400;
      cVar3 = pcVar5[sVar16];
      iVar9 = isspace((int)cVar3);
      iVar18 = 0;
      if ((iVar9 == 0) && (iVar18 = 1, cVar3 != '@')) {
        if (cVar3 == '#') {
          peVar6 = (local_220->context).
                   super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pbVar7 = (peVar6->file_buff).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pbVar7 != *(_Elt_pointer *)
                         ((long)&(peVar6->file_buff).
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
            (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            piVar1 = &(peVar6->file_buff).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            return;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_push_back_aux<>(&peVar6->file_buff);
          return;
        }
        iVar18 = -1;
      }
    }
    sVar16 = sVar16 + 1;
  } while (sVar4 != sVar16);
  if (iVar18 == 0) {
    return;
  }
  if (iVar18 != 1) {
LAB_0025a400:
    code_00 = local_1b8;
    prVar17 = local_220;
    peVar6 = (local_220->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (local_220->multi_line == true) {
      pbVar7 = (peVar6->file_buff).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar7 == *(_Elt_pointer *)
                     ((long)&(peVar6->file_buff).
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_push_back_aux<>(&peVar6->file_buff);
      }
      else {
        (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        piVar1 = &(peVar6->file_buff).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::__cxx11::string::_M_append
                ((char *)&prVar17->line_buff,(ulong)(local_1b8->_M_dataplus)._M_p);
      return;
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &peVar6->file_buff,local_1b8);
    run(prVar17,code_00);
    return;
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::swap((string *)&this->cmd_buff);
  iVar18 = std::__cxx11::string::compare((char *)&local_1d8);
  prVar17 = local_220;
  if ((iVar18 == 0) && (local_220->multi_line == false)) {
    local_220->multi_line = true;
    peVar6 = (local_220->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pbVar7 = (peVar6->file_buff).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar7 == *(_Elt_pointer *)
                   ((long)&(peVar6->file_buff).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_push_back_aux<>(&peVar6->file_buff);
    }
    else {
      (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      piVar1 = &(peVar6->file_buff).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    goto LAB_0025a6fe;
  }
  iVar18 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((iVar18 == 0) && (prVar17->multi_line == true)) {
    prVar17->multi_line = false;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::swap((string *)&prVar17->line_buff);
    run(prVar17,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_0025a6fe;
  }
  else {
    lVar11 = std::__cxx11::string::find((char)&local_1d8,0x3a);
    paVar2 = &local_218.field_2;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_218._M_dataplus._M_p = (pointer)paVar2;
    if (lVar11 != -1) {
      std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_1d8);
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_1d8);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_240);
      prVar17 = local_220;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        prVar17 = local_220;
      }
    }
    iVar18 = std::__cxx11::string::compare((char *)&local_1d8);
    if (iVar18 == 0) {
      local_240._M_dataplus._M_p = local_240._M_dataplus._M_p & 0xffffffff00000000;
      event_type::touch((event_type *)(current_process + 0xa8),&local_240);
    }
    else {
      iVar18 = std::__cxx11::string::compare((char *)&local_1d8);
      if (iVar18 == 0) {
        iVar18 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar18 == 0) {
          prVar17->encoding = ascii;
        }
        else {
          iVar18 = std::__cxx11::string::compare((char *)&local_218);
          if (iVar18 == 0) {
            prVar17->encoding = utf8;
          }
          else {
            iVar18 = std::__cxx11::string::compare((char *)&local_218);
            if (iVar18 != 0) {
              peVar13 = (exception *)__cxa_allocate_exception(0x90);
              sVar8 = prVar17->line_num;
              peVar6 = (prVar17->context).
                       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              pcVar5 = (peVar6->file_path)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,pcVar5,pcVar5 + (peVar6->file_path)._M_string_length);
              std::operator+(&local_1f8,"@",&local_1d8);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_240._M_dataplus._M_p = (pointer)*plVar14;
              psVar15 = (size_type *)(plVar14 + 2);
              if ((size_type *)local_240._M_dataplus._M_p == psVar15) {
                local_240.field_2._M_allocated_capacity = *psVar15;
                local_240.field_2._8_8_ = plVar14[3];
                local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
              }
              else {
                local_240.field_2._M_allocated_capacity = *psVar15;
              }
              local_240._M_string_length = plVar14[1];
              *plVar14 = (long)psVar15;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::operator+(&local_50,&local_240,&local_218);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"Unavailable encoding.","");
              exception::exception(peVar13,sVar8,&local_150,&local_50,&local_110);
              __cxa_throw(peVar13,&exception::typeinfo,exception::~exception);
            }
            prVar17->encoding = gbk;
          }
        }
      }
      else {
        iVar18 = std::__cxx11::string::compare((char *)&local_1d8);
        if (iVar18 != 0) {
          peVar13 = (exception *)__cxa_allocate_exception(0x90);
          sVar8 = prVar17->line_num;
          peVar6 = (prVar17->context).
                   super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          pcVar5 = (peVar6->file_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,pcVar5,pcVar5 + (peVar6->file_path)._M_string_length);
          std::operator+(&local_240,"@",&local_1d8);
          if (local_218._M_string_length == 0) {
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          }
          else {
            std::operator+(&local_1f8,": ",&local_218);
          }
          std::operator+(&local_f0,&local_240,&local_1f8);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Wrong grammar for preprocessor command.","");
          exception::exception(peVar13,sVar8,&local_170,&local_f0,&local_130);
          __cxa_throw(peVar13,&exception::typeinfo,exception::~exception);
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"210508","");
        sVar4 = local_218._M_string_length;
        sVar16 = local_218._M_string_length;
        if (local_240._M_string_length < local_218._M_string_length) {
          sVar16 = local_240._M_string_length;
        }
        if (sVar16 == 0) {
LAB_0025a5c9:
          uVar12 = 0xffffffff80000000;
          if (-0x80000000 < (long)(sVar4 - local_240._M_string_length)) {
            uVar12 = sVar4 - local_240._M_string_length;
          }
          if (0x7ffffffe < (long)uVar12) {
            uVar12 = 0x7fffffff;
          }
        }
        else {
          uVar10 = memcmp(local_218._M_dataplus._M_p,local_240._M_dataplus._M_p,sVar16);
          uVar12 = (ulong)uVar10;
          if (uVar10 == 0) goto LAB_0025a5c9;
        }
        prVar17 = local_220;
        if (0 < (int)uVar12) {
          peVar13 = (exception *)__cxa_allocate_exception(0x90);
          sVar8 = local_220->line_num;
          peVar6 = (local_220->context).
                   super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          pcVar5 = (peVar6->file_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,pcVar5,pcVar5 + (peVar6->file_path)._M_string_length);
          std::operator+(&local_90,"@",&local_1d8);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_1f8._M_dataplus._M_p = (pointer)*plVar14;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)local_1f8._M_dataplus._M_p == psVar15) {
            local_1f8.field_2._M_allocated_capacity = *psVar15;
            local_1f8.field_2._8_8_ = plVar14[3];
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar15;
          }
          local_1f8._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::operator+(&local_70,&local_1f8,&local_218);
          std::operator+(&local_d0,"Newer Language Standard required: ",&local_218);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_190._M_dataplus._M_p = (pointer)*plVar14;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)local_190._M_dataplus._M_p == psVar15) {
            local_190.field_2._M_allocated_capacity = *psVar15;
            local_190.field_2._8_8_ = plVar14[3];
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          }
          else {
            local_190.field_2._M_allocated_capacity = *psVar15;
          }
          local_190._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::operator+(&local_b0,&local_190,&local_240);
          exception::exception(peVar13,sVar8,&local_1b0,&local_70,&local_b0);
          __cxa_throw(peVar13,&exception::typeinfo,exception::~exception);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
      }
    }
    peVar6 = (prVar17->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pbVar7 = (peVar6->file_buff).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar7 == *(_Elt_pointer *)
                   ((long)&(peVar6->file_buff).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_push_back_aux<>(&peVar6->file_buff);
    }
    else {
      (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      piVar1 = &(peVar6->file_buff).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == paVar2) goto LAB_0025a6fe;
  }
  operator_delete(local_218._M_dataplus._M_p,
                  CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                           local_218.field_2._M_local_buf[0]) + 1);
LAB_0025a6fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void repl::exec(const string &code)
	{
		// Preprocess
		++line_num;
		int mode = 0;
		for (auto &ch: code) {
			if (mode == 0) {
				if (!std::isspace(ch)) {
					switch (ch) {
					case '#':
						context->file_buff.emplace_back();
						return;
					case '@':
						mode = 1;
						break;
					default:
						mode = -1;
					}
				}
			}
			else if (mode == 1) {
				if (!std::isspace(ch))
					cmd_buff.push_back(ch);
			}
			else
				break;
		}
		switch (mode) {
		default:
			break;
		case 0:
			return;
		case 1: {
			std::string cmd;
			std::swap(cmd_buff, cmd);
			if (cmd == "begin" && !multi_line) {
				multi_line = true;
				context->file_buff.emplace_back();
			}
			else if (cmd == "end" && multi_line) {
				multi_line = false;
				std::string line;
				std::swap(line_buff, line);
				this->run(line);
			}
			else {
				auto pos = cmd.find(':');
				std::string arg;
				if (pos != std::string::npos) {
					arg = cmd.substr(pos + 1);
					cmd = cmd.substr(0, pos);
				}
				if (cmd == "exit") {
					int code = 0;
					current_process->on_process_exit.touch(&code);
				}
				else if (cmd == "charset") {
					if (arg == "ascii")
						encoding = charset::ascii;
					else if (arg == "utf8")
						encoding = charset::utf8;
					else if (arg == "gbk")
						encoding = charset::gbk;
					else
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Unavailable encoding.");
				}
				else if (cmd == "require") {
					std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
					if (arg > version_str)
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Newer Language Standard required: " + arg + ", now on " + version_str);
				}
				else
					throw exception(line_num, context->file_path, "@" + cmd + (arg.empty() ? "" : ": " + arg),
					                "Wrong grammar for preprocessor command.");
				context->file_buff.emplace_back();
			}
			return;
		}
		}
		if (multi_line) {
			context->file_buff.emplace_back();
			line_buff.append(code);
		}
		else {
			context->file_buff.emplace_back(code);
			this->run(code);
		}
	}